

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QDateTime __thiscall
QLocale::toDateTime(QLocale *this,QString *string,FormatType format,int baseYear)

{
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  QString local_48;
  QCalendar local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  dateTimeFormat(&local_48,(QLocale *)string,baseYear);
  QCalendar::QCalendar(&local_30);
  toDateTime(this,string,(QString *)CONCAT44(in_register_00000014,format),
             (QCalendarBackend *)&local_48,(int)local_30.d_ptr);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDateTime)(Data)this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QLocale::toDateTime(const QString &string, FormatType format, int baseYear) const
{
    return toDateTime(string, dateTimeFormat(format), baseYear);
}